

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

Ivy_Man_t * Ivy_ManFrames(Ivy_Man_t *pMan,int nLatches,int nFrames,int fInit,Vec_Ptr_t **pvMapping)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Ivy_Man_t *p;
  Ivy_Obj_t *pIVar5;
  Vec_Ptr_t *pVVar6;
  void **__s;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  ulong uVar9;
  Ivy_Obj_t *p1;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long local_70;
  
  if (pMan->nObjs[4] != 0) {
    __assert_fail("Ivy_ManLatchNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0xb2,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0xb3,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  iVar4 = pMan->nObjs[1];
  uVar13 = pMan->nObjs[2] - nLatches;
  iVar3 = pMan->vObjs->nSize;
  p = Ivy_ManStart();
  uVar16 = (ulong)uVar13;
  uVar14 = (ulong)(uint)nLatches;
  uVar10 = uVar14;
  uVar11 = uVar16;
  if (0 < nLatches) {
    do {
      if (fInit == 0) {
        pIVar5 = Ivy_ObjCreatePi(p);
      }
      else {
        pIVar5 = (Ivy_Obj_t *)((ulong)p->pConst1 ^ 1);
      }
      if (((int)uVar11 < 0) || (pMan->vPos->nSize <= (int)uVar11)) goto LAB_007f5143;
      *(Ivy_Obj_t **)((long)pMan->vPos->pArray[uVar11] + 0x48) = pIVar5;
      uVar10 = uVar10 - 1;
      uVar11 = uVar11 + 1;
    } while (uVar10 != 0);
  }
  uVar2 = iVar4 - nLatches;
  iVar3 = iVar3 + -1;
  iVar4 = iVar3 * nFrames + 1;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < (uint)(iVar3 * nFrames)) {
    iVar8 = iVar4;
  }
  pVVar6->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar8 << 3);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar4;
  local_70 = 0;
  memset(__s,0,(long)iVar4 * 8);
  uVar10 = 0;
  do {
    pMan->pConst1->pEquiv = p->pConst1;
    if (0 < (int)uVar2) {
      uVar11 = 0;
      do {
        pIVar5 = Ivy_ObjCreatePi(p);
        if ((long)pMan->vPis->nSize <= (long)uVar11) goto LAB_007f5143;
        *(Ivy_Obj_t **)((long)pMan->vPis->pArray[uVar11] + 0x48) = pIVar5;
        uVar11 = uVar11 + 1;
      } while (uVar2 != uVar11);
    }
    if (0 < nLatches) {
      pVVar7 = pMan->vPos;
      uVar11 = uVar14;
      uVar9 = uVar16;
      uVar15 = (ulong)uVar2;
      do {
        if (((((int)uVar9 < 0) || (pVVar7->nSize <= (int)uVar9)) || ((int)uVar15 < 0)) ||
           (pMan->vPis->nSize <= (int)uVar15)) goto LAB_007f5143;
        *(undefined8 *)((long)pMan->vPis->pArray[uVar15] + 0x48) =
             *(undefined8 *)((long)pVVar7->pArray[uVar9] + 0x48);
        uVar15 = uVar15 + 1;
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    pVVar7 = pMan->vObjs;
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        pvVar1 = pVVar7->pArray[lVar12];
        if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
          if (((ulong)pvVar1 & 1) != 0) goto LAB_007f5162;
          uVar11 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pIVar5 = (Ivy_Obj_t *)0x0;
          }
          else {
            pIVar5 = (Ivy_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar11 + 0x48)
                     );
          }
          uVar11 = *(ulong *)((long)pvVar1 + 0x18) & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            p1 = (Ivy_Obj_t *)0x0;
          }
          else {
            p1 = (Ivy_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x18) & 1) ^ *(ulong *)(uVar11 + 0x48));
          }
          pIVar5 = Ivy_And(p,pIVar5,p1);
          *(Ivy_Obj_t **)((long)pvVar1 + 0x48) = pIVar5;
          pVVar7 = pMan->vObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar7->nSize);
    }
    if (0 < (int)uVar13) {
      pVVar7 = pMan->vPos;
      uVar11 = (ulong)(uint)pVVar7->nSize;
      uVar9 = 0;
      do {
        if ((long)(int)uVar11 <= (long)uVar9) goto LAB_007f5143;
        if (((ulong)pVVar7->pArray[uVar9] & 1) != 0) goto LAB_007f5162;
        uVar11 = *(ulong *)((long)pVVar7->pArray[uVar9] + 0x10);
        uVar15 = uVar11 & 0xfffffffffffffffe;
        if (uVar15 == 0) {
          pIVar5 = (Ivy_Obj_t *)0x0;
        }
        else {
          pIVar5 = (Ivy_Obj_t *)((ulong)((uint)uVar11 & 1) ^ *(ulong *)(uVar15 + 0x48));
        }
        pIVar5 = Ivy_ObjCreatePo(p,pIVar5);
        pVVar7 = pMan->vPos;
        uVar11 = (ulong)pVVar7->nSize;
        if ((long)uVar11 <= (long)uVar9) goto LAB_007f5143;
        *(Ivy_Obj_t **)((long)pVVar7->pArray[uVar9] + 0x48) = pIVar5;
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
    }
    if (0 < nLatches) {
      pVVar7 = pMan->vPos;
      uVar11 = uVar14;
      lVar12 = (long)(int)uVar13;
      do {
        if ((lVar12 < 0) || (pVVar7->nSize <= lVar12)) goto LAB_007f5143;
        pvVar1 = pVVar7->pArray[lVar12];
        if (((ulong)pvVar1 & 1) != 0) {
LAB_007f5162:
          __assert_fail("!Ivy_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                        ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
        }
        uVar9 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x48);
        }
        *(ulong *)((long)pvVar1 + 0x48) = uVar9;
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    pVVar7 = pMan->vObjs;
    uVar11 = (ulong)pVVar7->nSize;
    if (0 < (long)uVar11) {
      uVar9 = 0;
      do {
        pvVar1 = pVVar7->pArray[uVar9];
        if (pvVar1 != (void *)0x0) {
          if (((long)(local_70 + uVar9) < 0) || ((long)iVar4 <= (long)(local_70 + uVar9))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          __s[uVar9] = *(void **)((long)pvVar1 + 0x48);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar11);
    }
    uVar10 = uVar10 + 1;
    local_70 = local_70 + iVar3;
    __s = __s + iVar3;
  } while (uVar10 != (uint)nFrames);
  if (fInit == 0 && 0 < nLatches) {
    do {
      if (((int)uVar16 < 0) || (pMan->vPos->nSize <= (int)uVar16)) {
LAB_007f5143:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ObjCreatePo(p,*(Ivy_Obj_t **)((long)pMan->vPos->pArray[uVar16] + 0x48));
      uVar16 = uVar16 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  Ivy_ManCleanup(p);
  *pvMapping = pVVar6;
  iVar4 = Ivy_ManCheck(p);
  if (iVar4 == 0) {
    puts("Ivy_ManFrames(): The check has failed.");
  }
  return p;
}

Assistant:

Ivy_Man_t * Ivy_ManFrames( Ivy_Man_t * pMan, int nLatches, int nFrames, int fInit, Vec_Ptr_t ** pvMapping )
{
    Vec_Ptr_t * vMapping;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i, f, nPis, nPos, nIdMax;
    assert( Ivy_ManLatchNum(pMan) == 0 );
    assert( nFrames > 0 );
    // prepare the mapping
    nPis = Ivy_ManPiNum(pMan) - nLatches;
    nPos = Ivy_ManPoNum(pMan) - nLatches;
    nIdMax = Ivy_ManObjIdMax(pMan);
    // create the new manager
    pNew = Ivy_ManStart();
    // set the starting values of latch inputs
    for ( i = 0; i < nLatches; i++ )
        Ivy_ManPo(pMan, nPos+i)->pEquiv = fInit? Ivy_Not(Ivy_ManConst1(pNew)) : Ivy_ObjCreatePi(pNew);
    // add timeframes
    vMapping = Vec_PtrStart( nIdMax * nFrames + 1 );
    for ( f = 0; f < nFrames; f++ )
    {
        // create PIs
        Ivy_ManConst1(pMan)->pEquiv = Ivy_ManConst1(pNew);
        for ( i = 0; i < nPis; i++ )
            Ivy_ManPi(pMan, i)->pEquiv = Ivy_ObjCreatePi(pNew);
        // transfer values to latch outputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPi(pMan, nPis+i)->pEquiv = Ivy_ManPo(pMan, nPos+i)->pEquiv;
        // perform strashing
        Ivy_ManForEachNode( pMan, pObj, i )
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        // create POs
        for ( i = 0; i < nPos; i++ )
            Ivy_ManPo(pMan, i)->pEquiv = Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, i)) );
        // set the results of latch inputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPo(pMan, nPos+i)->pEquiv = Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, nPos+i));
        // save the pointers in this frame
        Ivy_ManForEachObj( pMan, pObj, i )
            Vec_PtrWriteEntry( vMapping, f * nIdMax + i, pObj->pEquiv );
    }
    // connect latches
    if ( !fInit )
        for ( i = 0; i < nLatches; i++ )
            Ivy_ObjCreatePo( pNew, Ivy_ManPo(pMan, nPos+i)->pEquiv );
    // remove dangling nodes
    Ivy_ManCleanup(pNew);
    *pvMapping = vMapping;
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManFrames(): The check has failed.\n" );
    return pNew;
}